

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::EnumFirstLastMethod::EnumFirstLastMethod
          (EnumFirstLastMethod *this,KnownSystemName knownNameId,bool first)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b1080;
  this->first = first;
  return;
}

Assistant:

EnumFirstLastMethod(KnownSystemName knownNameId, bool first) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), first(first) {}